

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void deqp::gles3::Performance::writeConditionalWorkload
               (ostringstream *stream,char *resultName,char *operandName)

{
  ostream *poVar1;
  int local_28;
  int i;
  int numMultiplications;
  char *operandName_local;
  char *resultName_local;
  ostringstream *stream_local;
  
  poVar1 = std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,resultName);
  std::operator<<(poVar1," = ");
  for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
    if (0 < local_28) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"*");
    }
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,operandName);
  }
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,";");
  return;
}

Assistant:

static void writeConditionalWorkload (std::ostringstream& stream, const char* resultName, const char* operandName)
{
	const int numMultiplications = 64;

	stream << resultName << " = ";

	for (int i = 0; i < numMultiplications; i++)
	{
		if (i > 0)
			stream << "*";

		stream << operandName;
	}

	stream << ";";
}